

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<double>_>::Multiply
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *A,TPZFMatrix<Fad<double>_> *B,
          int opt)

{
  int64_t iVar1;
  int64_t iVar2;
  ostream *poVar3;
  int in_ECX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_00000328;
  char *in_stack_00000330;
  Fad<double> *in_stack_ffffffffffffff10;
  TPZBaseMatrix *pTVar4;
  undefined1 local_68 [8];
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffffa0;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffffa8;
  undefined1 local_40 [36];
  int local_1c;
  TPZBaseMatrix *local_18;
  TPZBaseMatrix *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX == 0) {
    iVar1 = TPZBaseMatrix::Rows(in_RDX);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols(local_18);
      iVar2 = TPZBaseMatrix::Cols(local_10);
      if (iVar1 == iVar2) goto LAB_0132e657;
    }
    pTVar4 = local_18;
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(local_10);
    (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar4,iVar1,iVar2);
    goto LAB_0132e757;
  }
LAB_0132e657:
  if (local_1c == 0) {
LAB_0132e6f8:
    if ((local_1c != 0) && (in_RDI->fDecomposed != '\0')) {
      std::operator<<((ostream *)&std::cerr,
                      "virtual void TPZMatrix<Fad<double>>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = Fad<double>]"
                     );
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "\nERROR: Cannot multiply with opt when matrix is decomposed");
      std::operator<<(poVar3,"\nAborting...\n");
      pzinternal::DebugStopImpl(in_stack_00000330,in_stack_00000328);
    }
  }
  else {
    iVar1 = TPZBaseMatrix::Rows(local_18);
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = TPZBaseMatrix::Cols(local_18);
      iVar2 = TPZBaseMatrix::Cols(local_10);
      if (iVar1 == iVar2) goto LAB_0132e6f8;
    }
    pTVar4 = local_18;
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    iVar2 = TPZBaseMatrix::Cols(local_10);
    (*(pTVar4->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar4,iVar1,iVar2);
  }
LAB_0132e757:
  switch(in_RDI->fDecomposed) {
  case '\0':
    pTVar4 = local_18;
    Fad<double>::Fad<double,_nullptr>((Fad<double> *)local_18,(double *)local_10);
    Fad<double>::Fad<double,_nullptr>((Fad<double> *)pTVar4,(double *)local_10);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x27])
              (in_RDI,local_10,local_18,pTVar4,local_40,local_68,local_1c);
    Fad<double>::~Fad(in_stack_ffffffffffffff10);
    Fad<double>::~Fad(in_stack_ffffffffffffff10);
    break;
  case '\x01':
    TPZFMatrix<Fad<double>_>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x43])(in_RDI,local_18);
    break;
  default:
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZMatrix<Fad<double>>::Multiply(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, int) const [T = Fad<double>]"
                   );
    poVar3 = std::operator<<((ostream *)&std::cerr,"\nERROR: Cannot multiply with fDecomposed:");
    poVar3 = std::operator<<(poVar3,in_RDI->fDecomposed);
    std::operator<<(poVar3,"\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000330,in_stack_00000328);
    break;
  case '\x03':
    TPZFMatrix<Fad<double>_>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x44])(in_RDI,local_18);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x45])(in_RDI,local_18);
    break;
  case '\x04':
    TPZFMatrix<Fad<double>_>::operator=(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x46])(in_RDI,local_18);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x48])(in_RDI,local_18);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x47])(in_RDI,local_18);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Multiply(const TPZFMatrix<TVar> &A, TPZFMatrix<TVar>&B, int opt) const {
  
	
	if(!opt && (B.Rows() != Rows() || B.Cols() != A.Cols())) {
		B.Redim(Rows(),A.Cols());
	}
	else if (opt && (B.Rows() != Cols() || B.Cols() != A.Cols())) {
		B.Redim(Cols(),A.Cols());
	}else if(opt && this->fDecomposed){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with opt when matrix is decomposed"
           <<"\nAborting...\n";
    DebugStop();
  }
  
  switch(this->fDecomposed){
  case ENoDecompose:
    MultAdd( A, B, B, 1.0, 0.0, opt);
    break;
  case ELU:
    B=A;
    Substitution(&B);
    break;
  case ECholesky:
    B=A;
    Subst_Forward(&B);
    Subst_Backward(&B);
    break;
  case ELDLt:
    B=A;
    Subst_LForward(&B);
    Subst_Diag(&B);
    Subst_LBackward(&B);
    break;
  default:
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Cannot multiply with fDecomposed:"<<fDecomposed
           <<"\nAborting...\n";
    DebugStop();
  }
	
}